

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O2

void __thiscall
ThreadContext::RegisterLazyBailout
          (ThreadContext *this,PropertyId propertyId,EntryPointInfo *entryPoint)

{
  PropertyRecord *propertyRecord;
  PropertyGuardEntry *pPVar1;
  Recycler *alloc;
  WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
  *pWVar2;
  undefined1 local_58 [8];
  TrackAllocData data;
  bool foundExistingGuard;
  
  propertyRecord = GetPropertyName(this,propertyId);
  pPVar1 = EnsurePropertyGuardEntry(this,propertyRecord,(bool *)&data.field_0x27);
  pWVar2 = (pPVar1->entryPoints).ptr;
  if (pWVar2 == (WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
                 *)0x0) {
    local_58 = (undefined1  [8])
               &JsUtil::
                WeaklyReferencedKeyDictionary<Js::EntryPointInfo,unsigned_char,DefaultComparer<Js::EntryPointInfo_const*>,true>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_307ca64;
    data.filename._0_4_ = 0xdd4;
    alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
    pWVar2 = (WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
              *)new<Memory::Recycler>(0x50,alloc,0x37a1d4);
    JsUtil::
    WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
    ::WeaklyReferencedKeyDictionary(pWVar2,this->recycler,3,(EntryRemovalCallback *)0x0);
    Memory::
    WriteBarrierPtr<JsUtil::WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>_>
    ::WriteBarrierSet(&pPVar1->entryPoints,pWVar2);
    pWVar2 = (pPVar1->entryPoints).ptr;
  }
  JsUtil::
  WeaklyReferencedKeyDictionary<Js::EntryPointInfo,_unsigned_char,_DefaultComparer<const_Js::EntryPointInfo_*>,_true>
  ::UncheckedAdd(pWVar2,entryPoint,'\0');
  return;
}

Assistant:

void
ThreadContext::RegisterLazyBailout(Js::PropertyId propertyId, Js::EntryPointInfo* entryPoint)
{
    const Js::PropertyRecord * propertyRecord = GetPropertyName(propertyId);

    bool foundExistingGuard;
    PropertyGuardEntry* entry = EnsurePropertyGuardEntry(propertyRecord, foundExistingGuard);
    if (!entry->entryPoints)
    {
        entry->entryPoints = RecyclerNew(recycler, PropertyGuardEntry::EntryPointDictionary, recycler, /*capacity*/ 3);
    }
    entry->entryPoints->UncheckedAdd(entryPoint, NULL);
}